

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

string * __thiscall
testing::internal::PrintTestPartResultToString_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TestPartResult *test_part_result)

{
  uint uVar1;
  Type type;
  internal *this_00;
  Message *pMVar2;
  int in_ECX;
  char *local_60;
  char *local_58 [3];
  string local_40;
  Message local_20;
  TestPartResult *local_18;
  TestPartResult *test_part_result_local;
  
  local_18 = (TestPartResult *)this;
  test_part_result_local = (TestPartResult *)__return_storage_ptr__;
  Message::Message(&local_20);
  this_00 = (internal *)TestPartResult::file_name(local_18);
  uVar1 = TestPartResult::line_number(local_18);
  FormatFileLocation_abi_cxx11_(&local_40,this_00,(char *)(ulong)uVar1,in_ECX);
  pMVar2 = Message::operator<<(&local_20,&local_40);
  pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x1a056e);
  type = TestPartResult::type(local_18);
  local_58[0] = TestPartResultTypeToString(type);
  pMVar2 = Message::operator<<(pMVar2,local_58);
  local_60 = TestPartResult::message(local_18);
  pMVar2 = Message::operator<<(pMVar2,&local_60);
  Message::GetString_abi_cxx11_(__return_storage_ptr__,pMVar2);
  std::__cxx11::string::~string((string *)&local_40);
  Message::~Message(&local_20);
  return __return_storage_ptr__;
}

Assistant:

static std::string PrintTestPartResultToString(
    const TestPartResult& test_part_result) {
  return (Message()
          << internal::FormatFileLocation(test_part_result.file_name(),
                                          test_part_result.line_number())
          << " " << TestPartResultTypeToString(test_part_result.type())
          << test_part_result.message()).GetString();
}